

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extension_set.cc
# Opt level: O2

void __thiscall
google::protobuf::internal::ExtensionSet::SerializeWithCachedSizes
          (ExtensionSet *this,int start_field_number,int end_field_number,CodedOutputStream *output)

{
  const_iterator cVar1;
  key_type local_24;
  
  cVar1 = std::
          _Rb_tree<int,_std::pair<const_int,_google::protobuf::internal::ExtensionSet::Extension>,_std::_Select1st<std::pair<const_int,_google::protobuf::internal::ExtensionSet::Extension>_>,_std::less<int>,_std::allocator<std::pair<const_int,_google::protobuf::internal::ExtensionSet::Extension>_>_>
          ::lower_bound((_Rb_tree<int,_std::pair<const_int,_google::protobuf::internal::ExtensionSet::Extension>,_std::_Select1st<std::pair<const_int,_google::protobuf::internal::ExtensionSet::Extension>_>,_std::less<int>,_std::allocator<std::pair<const_int,_google::protobuf::internal::ExtensionSet::Extension>_>_>
                         *)this,&local_24);
  for (; ((_Rb_tree_header *)cVar1._M_node !=
          &(this->extensions_)._M_t._M_impl.super__Rb_tree_header &&
         ((int)cVar1._M_node[1]._M_color < end_field_number));
      cVar1._M_node = (_Base_ptr)std::_Rb_tree_increment(cVar1._M_node)) {
    Extension::SerializeFieldWithCachedSizes
              ((Extension *)&cVar1._M_node[1]._M_parent,cVar1._M_node[1]._M_color,output);
  }
  return;
}

Assistant:

void ExtensionSet::SerializeWithCachedSizes(
    int start_field_number, int end_field_number,
    io::CodedOutputStream* output) const {
  map<int, Extension>::const_iterator iter;
  for (iter = extensions_.lower_bound(start_field_number);
       iter != extensions_.end() && iter->first < end_field_number;
       ++iter) {
    iter->second.SerializeFieldWithCachedSizes(iter->first, output);
  }
}